

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::~WindowImplX11(WindowImplX11 *this)

{
  __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
  this_00;
  iterator this_01;
  EVP_PKEY_CTX *in_RSI;
  const_iterator in_RDI;
  Lock lock;
  vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<sf::priv::WindowImplX11_*const_*,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
  *in_stack_ffffffffffffffa0;
  Mutex *in_stack_ffffffffffffffa8;
  undefined1 *__val;
  __normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
  in_stack_ffffffffffffffb0;
  
  (((WindowImplX11 *)in_RDI._M_current)->super_WindowImpl)._vptr_WindowImpl =
       (_func_int **)&PTR__WindowImplX11_00493bf0;
  cleanup((WindowImplX11 *)in_RDI._M_current,in_RSI);
  if (((WindowImplX11 *)in_RDI._M_current)->m_iconPixmap != 0) {
    XFreePixmap(((WindowImplX11 *)in_RDI._M_current)->m_display,
                ((WindowImplX11 *)in_RDI._M_current)->m_iconPixmap);
  }
  if (((WindowImplX11 *)in_RDI._M_current)->m_iconMaskPixmap != 0) {
    XFreePixmap(((WindowImplX11 *)in_RDI._M_current)->m_display,
                ((WindowImplX11 *)in_RDI._M_current)->m_iconMaskPixmap);
  }
  if (((WindowImplX11 *)in_RDI._M_current)->m_hiddenCursor != 0) {
    XFreeCursor(((WindowImplX11 *)in_RDI._M_current)->m_display,
                ((WindowImplX11 *)in_RDI._M_current)->m_hiddenCursor);
  }
  if (((WindowImplX11 *)in_RDI._M_current)->m_inputContext != (XIC)0x0) {
    XDestroyIC(((WindowImplX11 *)in_RDI._M_current)->m_inputContext);
  }
  if ((((WindowImplX11 *)in_RDI._M_current)->m_window != 0) &&
     ((((WindowImplX11 *)in_RDI._M_current)->m_isExternal & 1U) == 0)) {
    XDestroyWindow(((WindowImplX11 *)in_RDI._M_current)->m_display,
                   ((WindowImplX11 *)in_RDI._M_current)->m_window);
    XFlush(((WindowImplX11 *)in_RDI._M_current)->m_display);
  }
  if (((WindowImplX11 *)in_RDI._M_current)->m_inputMethod != (XIM)0x0) {
    CloseXIM((XIM)in_stack_ffffffffffffffb0._M_current);
  }
  CloseDisplay((Display *)in_stack_ffffffffffffffb0._M_current);
  Lock::Lock((Lock *)in_stack_ffffffffffffffb0._M_current,in_stack_ffffffffffffffa8);
  __val = (anonymous_namespace)::WindowsImplX11Impl::allWindows;
  std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::begin
            (in_stack_ffffffffffffff98);
  std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::end
            (in_stack_ffffffffffffff98);
  this_00 = std::
            find<__gnu_cxx::__normal_iterator<sf::priv::WindowImplX11**,std::vector<sf::priv::WindowImplX11*,std::allocator<sf::priv::WindowImplX11*>>>,sf::priv::WindowImplX11*>
                      (in_RDI._M_current,in_stack_ffffffffffffffb0,(WindowImplX11 **)__val);
  __gnu_cxx::
  __normal_iterator<sf::priv::WindowImplX11*const*,std::vector<sf::priv::WindowImplX11*,std::allocator<sf::priv::WindowImplX11*>>>
  ::__normal_iterator<sf::priv::WindowImplX11**>
            (in_stack_ffffffffffffffa0,
             (__normal_iterator<sf::priv::WindowImplX11_**,_std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>_>
              *)in_stack_ffffffffffffff98);
  this_01 = std::vector<sf::priv::WindowImplX11_*,_std::allocator<sf::priv::WindowImplX11_*>_>::
            erase(this_00._M_current,in_RDI);
  Lock::~Lock((Lock *)this_01._M_current);
  WindowImpl::~WindowImpl((WindowImpl *)this_01._M_current);
  return;
}

Assistant:

WindowImplX11::~WindowImplX11()
{
    using namespace WindowsImplX11Impl;

    // Cleanup graphical resources
    cleanup();

    // Destroy icon pixmap
    if (m_iconPixmap)
        XFreePixmap(m_display, m_iconPixmap);

    // Destroy icon mask pixmap
    if (m_iconMaskPixmap)
        XFreePixmap(m_display, m_iconMaskPixmap);

    // Destroy the cursor
    if (m_hiddenCursor)
        XFreeCursor(m_display, m_hiddenCursor);

    // Destroy the input context
    if (m_inputContext)
        XDestroyIC(m_inputContext);

    // Destroy the window
    if (m_window && !m_isExternal)
    {
        XDestroyWindow(m_display, m_window);
        XFlush(m_display);
    }

    // Close the input method
    if (m_inputMethod)
        CloseXIM(m_inputMethod);

    // Close the connection with the X server
    CloseDisplay(m_display);

    // Remove this window from the global list of windows (required for focus request)
    Lock lock(allWindowsMutex);
    allWindows.erase(std::find(allWindows.begin(), allWindows.end(), this));
}